

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_copy_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params)

{
  int iVar1;
  long lVar2;
  char cVar3;
  uint8_t uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int *in_stack_00000008;
  int x;
  int y;
  int round_offset;
  int offset_bits;
  int bd;
  int bits;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int local_54;
  int local_4c;
  int local_48;
  
  lVar2 = *(long *)(in_stack_00000008 + 2);
  iVar1 = in_stack_00000008[4];
  bVar8 = ('\x0e' - (char)in_stack_00000008[6]) - (char)in_stack_00000008[5];
  cVar3 = '\x16' - (char)in_stack_00000008[5];
  iVar6 = (1 << (cVar3 - (char)in_stack_00000008[6] & 0x1fU)) +
          (1 << ((cVar3 - (char)in_stack_00000008[6]) - 1U & 0x1f));
  for (local_48 = 0; local_48 < in_R9D; local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < in_R8D; local_4c = local_4c + 1) {
      uVar5 = ((ushort)*(byte *)(in_RDI + (local_48 * in_ESI + local_4c)) << (bVar8 & 0x1f)) +
              (short)iVar6;
      if (*in_stack_00000008 == 0) {
        *(ushort *)(lVar2 + (long)(local_48 * iVar1 + local_4c) * 2) = uVar5;
      }
      else {
        uVar7 = (uint)*(ushort *)(lVar2 + (long)(local_48 * iVar1 + local_4c) * 2);
        if (in_stack_00000008[9] == 0) {
          local_54 = (int)(uVar5 + uVar7) >> 1;
        }
        else {
          local_54 = (int)(uVar7 * in_stack_00000008[10] + (uint)uVar5 * in_stack_00000008[0xb]) >>
                     4;
        }
        uVar4 = clip_pixel((local_54 - iVar6) + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f));
        *(uint8_t *)(in_RDX + (local_48 * in_ECX + local_4c)) = uVar4;
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_c(const uint8_t *src, int src_stride,
                                     uint8_t *dst, int dst_stride, int w, int h,
                                     ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}